

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void build_btree_sampler<float>
               (vector<double,_std::allocator<double>_> *btree_weights,float *sample_weights,
               size_t nrows,size_t *log2_n,size_t *btree_offset)

{
  uint64_t uVar1;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  bool bVar8;
  double dVar9;
  value_type_conflict local_38;
  
  uVar5 = nrows - 1 >> 1 | nrows - 1;
  uVar5 = uVar5 >> 2 | uVar5;
  uVar5 = uVar5 >> 4 | uVar5;
  uVar5 = uVar5 >> 8 | uVar5;
  uVar5 = uVar5 >> 0x10 | uVar5;
  uVar5 = uVar5 >> 0x20 | uVar5;
  uVar1 = tab64[(uVar5 - (uVar5 >> 1)) * 0x7edd5e59a4e28c2 >> 0x3a];
  sVar7 = uVar1 + 1;
  *log2_n = sVar7;
  pdVar2 = (btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 == pdVar3) {
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize
              (btree_weights,1L << ((char)uVar1 + 2U & 0x3f),&local_38);
  }
  else {
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (btree_weights,(long)pdVar3 - (long)pdVar2 >> 3,&local_38);
  }
  uVar5 = ~(-1L << ((byte)sVar7 & 0x3f));
  *btree_offset = uVar5;
  pdVar4 = (btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (nrows != 0) {
    sVar7 = 0;
    do {
      dVar9 = (double)sample_weights[sVar7];
      if (dVar9 <= 0.0) {
        dVar9 = 0.0;
      }
      pdVar4[uVar5 + sVar7] = dVar9;
      sVar7 = sVar7 + 1;
    } while (nrows != sVar7);
  }
  lVar6 = (long)(btree_weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
  if (lVar6 != 1) {
    uVar5 = lVar6 - 2;
    do {
      *(double *)((long)pdVar4 + (uVar5 & 0xfffffffffffffffe) * 4) =
           pdVar4[uVar5 + 1] + *(double *)((long)pdVar4 + (uVar5 & 0xfffffffffffffffe) * 4);
      bVar8 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar8);
  }
  if (*pdVar4 <= 0.0) {
    build_btree_sampler<float>();
  }
  return;
}

Assistant:

void build_btree_sampler(std::vector<double> &btree_weights, real_t *restrict sample_weights,
                         size_t nrows, size_t &restrict log2_n, size_t &restrict btree_offset)
{
    /* build a perfectly-balanced binary search tree in which each node will
       hold the sum of the weights of its children */
    log2_n = log2ceil(nrows);
    if (btree_weights.empty())
        btree_weights.resize(pow2(log2_n + 1), 0);
    else
        btree_weights.assign(btree_weights.size(), 0);
    btree_offset = pow2(log2_n) - 1;

    for (size_t ix = 0; ix < nrows; ix++)
        btree_weights[ix + btree_offset] = std::fmax(0., sample_weights[ix]);
    for (size_t ix = btree_weights.size() - 1; ix > 0; ix--)
        btree_weights[ix_parent(ix)] += btree_weights[ix];
    
    if (std::isnan(btree_weights[0]) || btree_weights[0] <= 0)
    {
        print_errmsg("Numeric precision error with sample weights, will not use them.\n");
        log2_n = 0;
        btree_weights.clear();
        btree_weights.shrink_to_fit();
    }
}